

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Gia_ManCountRanks_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vRoots,Vec_Int_t *vRanks,Vec_Int_t *vCands,int Rank
               )

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  int Rank_local;
  Vec_Int_t *vCands_local;
  Vec_Int_t *vRanks_local;
  Vec_Int_t *vRoots_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    Vec_IntWriteEntry(vRanks,iObj,Rank);
    pGVar2 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pGVar2);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pGVar2);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                        ,0x143,
                        "void Gia_ManCountRanks_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
      }
      else {
        pGVar2 = Gia_ObjRoToRi(p,pGVar2);
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
        Vec_IntPush(vRoots,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(pGVar2,iObj);
      Gia_ManCountRanks_rec(p,iVar1,vRoots,vRanks,vCands,Rank);
      iVar1 = Gia_ObjFaninId1(pGVar2,iObj);
      Gia_ManCountRanks_rec(p,iVar1,vRoots,vRanks,vCands,Rank);
    }
  }
  else {
    iVar1 = Vec_IntEntry(vRanks,iObj);
    if (iVar1 < Rank) {
      Vec_IntWriteEntry(vCands,iObj,1);
    }
  }
  return;
}

Assistant:

void Gia_ManCountRanks_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vRoots, Vec_Int_t * vRanks, Vec_Int_t * vCands, int Rank )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
    {
        if ( Vec_IntEntry(vRanks, iObj) < Rank )
            Vec_IntWriteEntry( vCands, iObj, 1 );
        return;
    }
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Vec_IntWriteEntry( vRanks, iObj, Rank );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCountRanks_rec( p, Gia_ObjFaninId0(pObj, iObj), vRoots, vRanks, vCands, Rank );
        Gia_ManCountRanks_rec( p, Gia_ObjFaninId1(pObj, iObj), vRoots, vRanks, vCands, Rank );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( !Gia_ObjIsPi(p, pObj) )
        assert( 0 );
}